

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::IfcTransportElement(IfcTransportElement *this)

{
  IfcTransportElement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x190,"IfcTransportElement");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0100ab48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTransportElement,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTransportElement,_3UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__0100ac38);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x100aa40;
  *(undefined8 *)&this->field_0x190 = 0x100ab30;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x100aa68;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x100aa90;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x100aab8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x100aae0;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x100ab08;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcElement).field_0x148);
  STEP::Maybe<double>::Maybe(&this->CapacityByWeight);
  STEP::Maybe<double>::Maybe(&this->CapacityByNumber);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}